

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retLvalue.c
# Opt level: O1

int Abc_NtkRetimeLValue(Abc_Ntk_t *pNtk,int nIterLimit,int fVerbose)

{
  int iVar1;
  void *pvVar2;
  int Fi;
  int iVar3;
  uint Fi_00;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vLatches;
  void **ppvVar4;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  void *pvVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  timespec ts;
  timespec local_40;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic( pNtk )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retLvalue.c"
                  ,0x41,"int Abc_NtkRetimeLValue(Abc_Ntk_t *, int, int)");
  }
  iVar1 = pNtk->nObjCounts[8];
  Fi = Abc_NtkLevel(pNtk);
  ppvVar4 = (void **)0x0;
  vNodes = Abc_NtkDfs(pNtk,0);
  iVar3 = pNtk->nObjCounts[8];
  vLatches = (Vec_Ptr_t *)malloc(0x10);
  iVar8 = 8;
  if (6 < iVar3 - 1U) {
    iVar8 = iVar3;
  }
  vLatches->nSize = 0;
  vLatches->nCap = iVar8;
  if (iVar8 != 0) {
    ppvVar4 = (void **)malloc((long)iVar8 << 3);
  }
  vLatches->pArray = ppvVar4;
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar3 = pNtk->vObjs->nSize;
    uVar11 = (long)iVar3 + 500;
    iVar8 = (int)uVar11;
    if ((pNtk->vTravIds).nCap < iVar8) {
      piVar5 = (int *)malloc(uVar11 * 4);
      (pNtk->vTravIds).pArray = piVar5;
      if (piVar5 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar8;
    }
    if (-500 < iVar3) {
      memset((pNtk->vTravIds).pArray,0,(uVar11 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar8;
  }
  iVar3 = pNtk->nTravIds;
  pNtk->nTravIds = iVar3 + 1;
  if (iVar3 < 0x3fffffff) {
    pVVar6 = pNtk->vBoxes;
    if (0 < pVVar6->nSize) {
      lVar10 = 0;
      do {
        if ((*(uint *)&((Abc_Obj_t *)pVVar6->pArray[lVar10])->field_0x14 & 0xf) == 8) {
          Abc_ManCollectLatches_rec((Abc_Obj_t *)pVVar6->pArray[lVar10],vLatches);
        }
        lVar10 = lVar10 + 1;
        pVVar6 = pNtk->vBoxes;
      } while (lVar10 < pVVar6->nSize);
    }
    if (vLatches->nSize == pNtk->nObjCounts[8]) {
      iVar3 = Abc_NtkRetimeForPeriod(pNtk,vNodes,vLatches,Fi,nIterLimit,fVerbose);
      if (iVar3 == 0) {
        if (vLatches->pArray != (void **)0x0) {
          free(vLatches->pArray);
          vLatches->pArray = (void **)0x0;
        }
        free(vLatches);
        if (vNodes->pArray != (void **)0x0) {
          free(vNodes->pArray);
          vNodes->pArray = (void **)0x0;
        }
        if (vNodes != (Vec_Ptr_t *)0x0) {
          free(vNodes);
        }
        puts("Abc_NtkRetimeGetLags() error: The upper bound on the clock period cannot be computed."
            );
        uVar11 = (ulong)pNtk->vObjs->nSize;
        lVar10 = uVar11 + 1;
        piVar5 = (int *)malloc(0x10);
        iVar8 = (int)lVar10;
        iVar3 = 0x10;
        if (0xe < uVar11) {
          iVar3 = iVar8;
        }
        piVar5[1] = 0;
        *piVar5 = iVar3;
        if (iVar3 == 0) {
          pvVar7 = (void *)0x0;
        }
        else {
          pvVar7 = malloc((long)iVar3 << 2);
        }
        *(void **)(piVar5 + 2) = pvVar7;
        piVar5[1] = iVar8;
        if (pvVar7 != (void *)0x0) {
          memset(pvVar7,0,lVar10 * 4);
        }
      }
      else {
        clock_gettime(3,&local_40);
        Fi_00 = Abc_NtkRetimeSearch_rec(pNtk,vNodes,vLatches,0,Fi,nIterLimit,fVerbose);
        clock_gettime(3,&local_40);
        iVar3 = Abc_NtkRetimeForPeriod(pNtk,vNodes,vLatches,Fi_00,nIterLimit,fVerbose);
        if (iVar3 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retLvalue.c"
                        ,0x79,"Vec_Int_t *Abc_NtkRetimeGetLags(Abc_Ntk_t *, int, int)");
        }
        pVVar6 = pNtk->vObjs;
        uVar9 = pVVar6->nSize;
        if (0 < (int)uVar9) {
          lVar10 = 0;
          do {
            pvVar7 = pVVar6->pArray[lVar10];
            if (((pvVar7 != (void *)0x0) && ((*(uint *)((long)pvVar7 + 0x14) & 0xf) == 7)) &&
               (*(int *)((long)pvVar7 + 0x40) < -500000000)) {
              *(undefined8 *)((long)pvVar7 + 0x40) = 0;
            }
            lVar10 = lVar10 + 1;
            pVVar6 = pNtk->vObjs;
            uVar9 = pVVar6->nSize;
          } while (lVar10 < (int)uVar9);
        }
        iVar8 = uVar9 + 1;
        piVar5 = (int *)malloc(0x10);
        iVar3 = 0x10;
        if (0xe < uVar9) {
          iVar3 = iVar8;
        }
        piVar5[1] = 0;
        *piVar5 = iVar3;
        if (iVar3 == 0) {
          pvVar7 = (void *)0x0;
        }
        else {
          pvVar7 = malloc((long)iVar3 << 2);
        }
        *(void **)(piVar5 + 2) = pvVar7;
        piVar5[1] = iVar8;
        if (pvVar7 != (void *)0x0) {
          memset(pvVar7,0,(long)iVar8 << 2);
        }
        if (0 < pVVar6->nSize) {
          ppvVar4 = pVVar6->pArray;
          lVar10 = 0;
          do {
            pvVar2 = ppvVar4[lVar10];
            if ((pvVar2 != (void *)0x0) && ((*(uint *)((long)pvVar2 + 0x14) & 0xf) == 7)) {
              iVar3 = *(int *)((long)pvVar2 + 0x10);
              if (((long)iVar3 < 0) || ((int)uVar9 < iVar3)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              *(int *)((long)pvVar7 + (long)iVar3 * 4) =
                   (int)(char)((char)((int)(Fi_00 * 0x10000 + *(int *)((long)pvVar2 + 0x40)) /
                                     (int)Fi_00) - (*(int *)((long)pvVar2 + 0x40) % (int)Fi_00 == 0)
                              );
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < pVVar6->nSize);
        }
        printf("The best clock period is %3d. (Currently, network is not modified.)\n",(ulong)Fi_00)
        ;
        if (vNodes->pArray != (void **)0x0) {
          free(vNodes->pArray);
          vNodes->pArray = (void **)0x0;
        }
        if (vNodes != (Vec_Ptr_t *)0x0) {
          free(vNodes);
        }
        if (vLatches->pArray != (void **)0x0) {
          free(vLatches->pArray);
          vLatches->pArray = (void **)0x0;
        }
        free(vLatches);
      }
      if (*(void **)(piVar5 + 2) != (void *)0x0) {
        free(*(void **)(piVar5 + 2));
        piVar5[2] = 0;
        piVar5[3] = 0;
      }
      free(piVar5);
      iVar3 = Abc_NtkCheck(pNtk);
      if (iVar3 == 0) {
        fwrite("Abc_NtkRetimeLValue(): Network check has failed.\n",0x31,1,_stdout);
      }
      return iVar1 - pNtk->nObjCounts[8];
    }
    __assert_fail("Vec_PtrSize(vLatches) == Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retLvalue.c"
                  ,0x15b,"Vec_Ptr_t *Abc_ManCollectLatches(Abc_Ntk_t *)");
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkRetimeLValue( Abc_Ntk_t * pNtk, int nIterLimit, int fVerbose )
{
    Vec_Int_t * vLags;
    int nLatches = Abc_NtkLatchNum(pNtk);
    assert( Abc_NtkIsLogic( pNtk ) );
    // get the lags
    vLags = Abc_NtkRetimeGetLags( pNtk, nIterLimit, fVerbose );
    // compute the retiming
//    Abc_NtkRetimeUsingLags( pNtk, vLags, fVerbose );
    Vec_IntFree( vLags );
    // fix the COs
//    Abc_NtkLogicMakeSimpleCos( pNtk, 0 );
    // check for correctness
    if ( !Abc_NtkCheck( pNtk ) )
        fprintf( stdout, "Abc_NtkRetimeLValue(): Network check has failed.\n" );
    // return the number of latches saved
    return nLatches - Abc_NtkLatchNum(pNtk);
}